

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O1

void qt_draw_decoration_for_glyphs
               (QPainter *painter,QPointF *decorationPosition,glyph_t *glyphArray,
               QFixedPoint *positions,int glyphCount,QFontEngine *fontEngine,bool underline,
               bool overline,bool strikeOut)

{
  int iVar1;
  int iVar2;
  QFlagsStorage<QTextItem::RenderFlag> flags;
  int iVar3;
  long lVar4;
  Int IVar5;
  long lVar6;
  long in_FS_OFFSET;
  QPointF local_78;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined1 *local_58;
  QTextFormat local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((underline || overline) || strikeOut) {
    IVar5 = (uint)underline * 0x20 + 0x10;
    if (!overline) {
      IVar5 = (uint)underline * 0x20;
    }
    flags.i = IVar5 + 0x40;
    if (!strikeOut) {
      flags.i = IVar5;
    }
    iVar3 = positions[(long)glyphCount + -1].x.val;
    lVar4 = (long)glyphCount + -1;
    iVar1 = (positions->x).val;
    iVar2 = (positions->y).val;
    lVar6 = lVar4;
    if (iVar3 < iVar1) {
      lVar6 = 0;
    }
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = 0xaaaaaaaa;
    uStack_64 = 0xaaaaaaaa;
    uStack_60 = 0xaaaaaaaa;
    uStack_5c = 0xaaaaaaaa;
    if (iVar1 <= iVar3) {
      lVar4 = 0;
    }
    (*fontEngine->_vptr_QFontEngine[0x1c])(&local_68,fontEngine,(ulong)glyphArray[lVar6]);
    iVar3 = positions[lVar6].x.val + (int)local_58;
    iVar1 = positions[lVar4].x.val;
    local_78.xp = decorationPosition->xp;
    local_78.yp = (double)iVar2 * 0.015625;
    QTextCharFormat::QTextCharFormat((QTextCharFormat *)&local_48);
    drawTextItemDecoration
              (painter,&local_78,fontEngine,(QTextEngine *)0x0,(uint)underline,(RenderFlags)flags.i,
               (double)(iVar3 - iVar1) * 0.015625,(QTextCharFormat *)&local_48);
    QTextFormat::~QTextFormat(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void qt_draw_decoration_for_glyphs(QPainter *painter,
                                          const QPointF &decorationPosition,
                                          const glyph_t *glyphArray,
                                          const QFixedPoint *positions,
                                          int glyphCount,
                                          QFontEngine *fontEngine,
                                          bool underline,
                                          bool overline,
                                          bool strikeOut)
{
    if (!underline && !overline && !strikeOut)
        return;

    QTextItem::RenderFlags flags;
    if (underline)
        flags |= QTextItem::Underline;
    if (overline)
        flags |= QTextItem::Overline;
    if (strikeOut)
        flags |= QTextItem::StrikeOut;

    bool rtl = positions[glyphCount - 1].x < positions[0].x;
    QFixed baseline = positions[0].y;
    glyph_metrics_t gm = fontEngine->boundingBox(glyphArray[rtl ? 0 : glyphCount - 1]);

    qreal width = rtl
            ? (positions[0].x + gm.xoff - positions[glyphCount - 1].x).toReal()
            : (positions[glyphCount - 1].x + gm.xoff - positions[0].x).toReal();

    drawTextItemDecoration(painter,
                           QPointF(decorationPosition.x(), baseline.toReal()),
                           fontEngine,
                           nullptr, // textEngine
                           underline ? QTextCharFormat::SingleUnderline
                                     : QTextCharFormat::NoUnderline,
                           flags,
                           width,
                           QTextCharFormat());
}